

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraphTest.cpp
# Opt level: O0

void __thiscall DynamicGraphTest::testInit(DynamicGraphTest *this)

{
  initializer_list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> __l;
  unsigned_long uVar1;
  ostream *this_00;
  DynamicGraph *v;
  EVP_PKEY_CTX *in_RSI;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> local_119;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_118;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_f8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_d8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_b8;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_98;
  unsigned_long local_80;
  unsigned_long uStack_78;
  property_type *local_70;
  unsigned_long local_68;
  unsigned_long uStack_60;
  property_type *local_58;
  unsigned_long local_50;
  unsigned_long uStack_48;
  property_type *local_40;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  expectedVirtualEdges;
  DynamicGraphTest *this_local;
  
  expectedVirtualEdges.
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = (size_t)this;
  DynamicGraph::init(&this->G,in_RSI);
  uVar1 = DynamicGraph::getLevel(&this->G,0);
  if (uVar1 != 0) {
    __assert_fail("G.getLevel(0)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x30,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,1);
  if (uVar1 != 1) {
    __assert_fail("G.getLevel(1)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x31,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,2);
  if (uVar1 != 1) {
    __assert_fail("G.getLevel(2)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x32,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,3);
  if (uVar1 != 2) {
    __assert_fail("G.getLevel(3)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x33,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,4);
  if (uVar1 != 1) {
    __assert_fail("G.getLevel(4)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x34,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,5);
  if (uVar1 != 2) {
    __assert_fail("G.getLevel(5)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x35,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,6);
  if (uVar1 != 2) {
    __assert_fail("G.getLevel(6)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x36,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,7);
  if (uVar1 != 1) {
    __assert_fail("G.getLevel(7)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x37,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,8);
  if (uVar1 != 2) {
    __assert_fail("G.getLevel(8)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x38,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,9);
  if (uVar1 != 1) {
    __assert_fail("G.getLevel(9)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x39,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,10);
  if (uVar1 != 2) {
    __assert_fail("G.getLevel(10)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3a,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,0xb);
  if (uVar1 != 2) {
    __assert_fail("G.getLevel(11)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3b,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,0xc);
  if (uVar1 != 3) {
    __assert_fail("G.getLevel(12)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3c,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,0xd);
  if (uVar1 != 3) {
    __assert_fail("G.getLevel(13)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3d,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,0xe);
  if (uVar1 != 4) {
    __assert_fail("G.getLevel(14)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3e,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,0xf);
  if (uVar1 != 3) {
    __assert_fail("G.getLevel(15)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3f,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,0x10);
  if (uVar1 != 1) {
    __assert_fail("G.getLevel(16)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x40,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,0x11);
  if (uVar1 != 2) {
    __assert_fail("G.getLevel(17)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x41,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,0x12);
  if (uVar1 != 3) {
    __assert_fail("G.getLevel(18)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x42,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getLevel(&this->G,0x13);
  if (uVar1 != 2) {
    __assert_fail("G.getLevel(19)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x43,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,0);
  if (uVar1 != 1) {
    __assert_fail("G.getComponent(0)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x46,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,1);
  if (uVar1 != 1) {
    __assert_fail("G.getComponent(1)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x47,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,2);
  if (uVar1 != 1) {
    __assert_fail("G.getComponent(2)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x48,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,3);
  if (uVar1 != 1) {
    __assert_fail("G.getComponent(3)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x49,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,4);
  if (uVar1 != 2) {
    __assert_fail("G.getComponent(4)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4a,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,5);
  if (uVar1 != 2) {
    __assert_fail("G.getComponent(5)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4b,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,6);
  if (uVar1 != 2) {
    __assert_fail("G.getComponent(6)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4c,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,7);
  if (uVar1 != 3) {
    __assert_fail("G.getComponent(7)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4d,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,8);
  if (uVar1 != 3) {
    __assert_fail("G.getComponent(8)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4e,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,9);
  if (uVar1 != 4) {
    __assert_fail("G.getComponent(9)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4f,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,10);
  if (uVar1 != 4) {
    __assert_fail("G.getComponent(10)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x50,"void DynamicGraphTest::testInit()");
  }
  uVar1 = DynamicGraph::getComponent(&this->G,0xb);
  if (uVar1 == 4) {
    uVar1 = DynamicGraph::getComponent(&this->G,0xc);
    if (uVar1 != 4) {
      __assert_fail("G.getComponent(12)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x52,"void DynamicGraphTest::testInit()");
    }
    uVar1 = DynamicGraph::getComponent(&this->G,0xd);
    if (uVar1 != 4) {
      __assert_fail("G.getComponent(13)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x53,"void DynamicGraphTest::testInit()");
    }
    uVar1 = DynamicGraph::getComponent(&this->G,0xe);
    if (uVar1 != 4) {
      __assert_fail("G.getComponent(14)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x54,"void DynamicGraphTest::testInit()");
    }
    uVar1 = DynamicGraph::getComponent(&this->G,0xf);
    if (uVar1 != 4) {
      __assert_fail("G.getComponent(15)==4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x55,"void DynamicGraphTest::testInit()");
    }
    uVar1 = DynamicGraph::getComponent(&this->G,0x10);
    if (uVar1 != 5) {
      __assert_fail("G.getComponent(16)==5",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x56,"void DynamicGraphTest::testInit()");
    }
    uVar1 = DynamicGraph::getComponent(&this->G,0x11);
    if (uVar1 != 5) {
      __assert_fail("G.getComponent(17)==5",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x57,"void DynamicGraphTest::testInit()");
    }
    uVar1 = DynamicGraph::getComponent(&this->G,0x12);
    if (uVar1 != 5) {
      __assert_fail("G.getComponent(18)==5",
                    "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                    ,0x58,"void DynamicGraphTest::testInit()");
    }
    uVar1 = DynamicGraph::getComponent(&this->G,0x13);
    if (uVar1 == 5) {
      v = &this->G;
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_b8,(boost *)0x0,4,(vertex_descriptor)v,in_R8);
      local_98.m_eproperty = local_b8.first.m_eproperty;
      local_98.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
           local_b8.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      local_98.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
           local_b8.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_d8,(boost *)0x0,7,(vertex_descriptor)v,in_R8);
      local_70 = local_d8.first.m_eproperty;
      local_80 = local_d8.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      uStack_78 = local_d8.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_f8,(boost *)0x0,9,(vertex_descriptor)v,in_R8);
      local_58 = local_f8.first.m_eproperty;
      local_68 = local_f8.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      uStack_60 = local_f8.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_118,(boost *)0x0,0x10,(vertex_descriptor)v,in_R8);
      local_40 = local_118.first.m_eproperty;
      local_50 = local_118.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      uStack_48 = local_118.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      local_38 = &local_98;
      local_30 = 4;
      std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
      allocator(&local_119);
      __l._M_len = local_30;
      __l._M_array = local_38;
      std::__cxx11::
      list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::list((list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              *)local_28,__l,&local_119);
      std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
      ~allocator(&local_119);
      testVirtualEdges(this,(list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                             *)local_28);
      this_00 = std::operator<<((ostream *)&std::cout,"[+] test init OK!");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::
      list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::~list((list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
               *)local_28);
      return;
    }
    __assert_fail("G.getComponent(19)==5",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x59,"void DynamicGraphTest::testInit()");
  }
  __assert_fail("G.getComponent(11)==4",
                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                ,0x51,"void DynamicGraphTest::testInit()");
}

Assistant:

void DynamicGraphTest::testInit()
{
    this->G.init();

    // test levels
    assert(G.getLevel(0)==0);
    assert(G.getLevel(1)==1);
    assert(G.getLevel(2)==1);
    assert(G.getLevel(3)==2);
    assert(G.getLevel(4)==1);
    assert(G.getLevel(5)==2);
    assert(G.getLevel(6)==2);
    assert(G.getLevel(7)==1);
    assert(G.getLevel(8)==2);
    assert(G.getLevel(9)==1);
    assert(G.getLevel(10)==2);
    assert(G.getLevel(11)==2);
    assert(G.getLevel(12)==3);
    assert(G.getLevel(13)==3);
    assert(G.getLevel(14)==4);
    assert(G.getLevel(15)==3);
    assert(G.getLevel(16)==1);
    assert(G.getLevel(17)==2);
    assert(G.getLevel(18)==3);
    assert(G.getLevel(19)==2);

    // test components
    assert(G.getComponent(0)==1);
    assert(G.getComponent(1)==1);
    assert(G.getComponent(2)==1);
    assert(G.getComponent(3)==1);
    assert(G.getComponent(4)==2);
    assert(G.getComponent(5)==2);
    assert(G.getComponent(6)==2);
    assert(G.getComponent(7)==3);
    assert(G.getComponent(8)==3);
    assert(G.getComponent(9)==4);
    assert(G.getComponent(10)==4);
    assert(G.getComponent(11)==4);
    assert(G.getComponent(12)==4);
    assert(G.getComponent(13)==4);
    assert(G.getComponent(14)==4);
    assert(G.getComponent(15)==4);
    assert(G.getComponent(16)==5);
    assert(G.getComponent(17)==5);
    assert(G.getComponent(18)==5);
    assert(G.getComponent(19)==5);

    // test virtual edges
    std::list<Edge> expectedVirtualEdges = {
            edge(0, 4, G).first,
            edge(0, 7, G).first,
            edge(0, 9, G).first,
            edge(0, 16, G).first
    };
    testVirtualEdges(expectedVirtualEdges);


    std::cout << "[+] test init OK!" << std::endl;
}